

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O0

void __thiscall MakefileGenerator::initCompiler(MakefileGenerator *this,Compiler *comp)

{
  bool bVar1;
  ProKey *this_00;
  long in_RSI;
  MakefileGenerator *in_RDI;
  long in_FS_OFFSET;
  uchar flags;
  ProStringList *l;
  ProValueMap *v;
  QStringBuilder<const_char_(&)[7],_const_QString_&> *in_stack_ffffffffffffff08;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  byte local_c9;
  undefined1 in_stack_ffffffffffffff38 [16];
  QString *in_stack_ffffffffffffffe0;
  uchar in_stack_ffffffffffffffef;
  ProStringList *in_stack_fffffffffffffff0;
  MakefileGenerator *this_01;
  
  this_01 = *(MakefileGenerator **)(in_FS_OFFSET + 0x28);
  this_00 = (ProKey *)QMakeProject::variables((QMakeProject *)0x178d2b);
  ProKey::ProKey(this_00,(QString *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
  QMap<ProKey,_ProStringList>::operator[]
            (in_stack_ffffffffffffff38._8_8_,in_stack_ffffffffffffff38._0_8_);
  ProKey::~ProKey((ProKey *)0x178d7f);
  bVar1 = QHash<QString,_bool>::contains
                    ((QHash<QString,_bool> *)this_00,
                     (QString *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
  if (!bVar1) {
    QHash<QString,_bool>::insert
              ((QHash<QString,_bool> *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10)
               ,(QString *)in_stack_ffffffffffffff08,(bool *)0x178dcd);
    bVar1 = noIO(in_RDI);
    if (!bVar1) {
      local_c9 = 0;
      if ((*(uint *)(in_RSI + 0x18) & 4) != 0) {
        local_c9 = 2;
      }
      if ((*(uint *)(in_RSI + 0x18) & 8) != 0) {
        local_c9 = local_c9 | 1;
      }
      ProStringList::ProStringList
                ((ProStringList *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                 (ProStringList *)in_stack_ffffffffffffff08);
      ::operator+((char (*) [7])CONCAT17(local_c9,in_stack_ffffffffffffff10),
                  (QString *)in_stack_ffffffffffffff08);
      ::QStringBuilder::operator_cast_to_QString(in_stack_ffffffffffffff08);
      findFilesInVPATH(this_01,in_stack_fffffffffffffff0,in_stack_ffffffffffffffef,
                       in_stack_ffffffffffffffe0);
      ProStringList::operator=
                ((ProStringList *)CONCAT17(local_c9,in_stack_ffffffffffffff10),
                 (ProStringList *)in_stack_ffffffffffffff08);
      ProStringList::~ProStringList((ProStringList *)0x178eaf);
      QString::~QString((QString *)0x178eb9);
      ProStringList::~ProStringList((ProStringList *)0x178ec6);
    }
  }
  if (*(MakefileGenerator **)(in_FS_OFFSET + 0x28) != this_01) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void
MakefileGenerator::initCompiler(const MakefileGenerator::Compiler &comp)
{
    ProValueMap &v = project->variables();
    ProStringList &l = v[ProKey(comp.variable_in)];
    // find all the relevant file inputs
    if(!init_compiler_already.contains(comp.variable_in)) {
        init_compiler_already.insert(comp.variable_in, true);
        if(!noIO()) {
            uchar flags = 0;
            if (comp.flags & Compiler::CompilerRemoveNoExist)
                flags |= VPATH_RemoveMissingFiles;
            if (comp.flags & Compiler::CompilerWarnNoExist)
                flags |= VPATH_WarnMissingFiles;
            l = findFilesInVPATH(l, flags, "VPATH_" + comp.variable_in);
        }
    }
}